

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeMeasure.h
# Opt level: O1

void __thiscall dg::debug::TimeMeasure::report(TimeMeasure *this,string *prefix,ostream *out)

{
  ostream *poVar1;
  
  (this->elapsed).__r = (this->e).__d.__r - (this->s).__d.__r;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," sec ",5);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void report(const std::string &prefix = "", std::ostream &out = std::cerr) {
        // compute the duration
        duration();

        out << prefix << " ";

        const auto msec =
                std::chrono::duration_cast<std::chrono::milliseconds>(elapsed)
                        .count() %
                ms_in_sec;
        const auto sec =
                std::chrono::duration_cast<std::chrono::seconds>(elapsed)
                        .count();
        out << sec << " sec " << msec << " ms" << std::endl;
    }